

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsParticle_dns.c
# Opt level: O0

int PrintStats(void *cvode_mem)

{
  undefined8 in_RDI;
  long netf;
  long ncfn;
  long nni;
  long nje;
  long nsetups;
  long nfe;
  long nst;
  int retval;
  undefined4 local_48;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_c;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_c = CVodeGetNumSteps(in_RDI,&local_18);
  check_retval(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  local_c = CVodeGetNumRhsEvals(local_8,&local_20);
  check_retval(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  local_c = CVodeGetNumLinSolvSetups(local_8,&local_28);
  check_retval(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  local_c = CVodeGetNumErrTestFails(local_8,&local_48);
  check_retval(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  local_c = CVodeGetNumNonlinSolvIters(local_8,&stack0xffffffffffffffc8);
  check_retval(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  local_c = CVodeGetNumNonlinSolvConvFails(local_8,&stack0xffffffffffffffc0);
  check_retval(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  local_c = CVodeGetNumJacEvals(local_8,&local_30);
  check_retval(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  printf("\nIntegration Statistics:\n");
  printf("Number of steps taken = %-6ld\n",local_18);
  printf("Number of function evaluations = %-6ld\n",local_20);
  printf("Number of linear solver setups = %-6ld\n",local_28);
  printf("Number of Jacobian evaluations = %-6ld\n",local_30);
  printf("Number of nonlinear solver iterations = %-6ld\n",in_stack_ffffffffffffffc8);
  printf("Number of convergence failures = %-6ld\n",in_stack_ffffffffffffffc0);
  printf("Number of error test failures = %-6ld\n",CONCAT44(in_stack_ffffffffffffffbc,local_48));
  return 0;
}

Assistant:

static int PrintStats(void* cvode_mem)
{
  int retval;
  long int nst, nfe, nsetups, nje, nni, ncfn, netf;

  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(&retval, "CVodeGetNumRhsEvals", 1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(&retval, "CVodeGetNumLinSolvSetups", 1);
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(&retval, "CVodeGetNumErrTestFails", 1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(&retval, "CVodeGetNumNonlinSolvIters", 1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1);

  retval = CVodeGetNumJacEvals(cvode_mem, &nje);
  check_retval(&retval, "CVodeGetNumJacEvals", 1);

  printf("\nIntegration Statistics:\n");

  printf("Number of steps taken = %-6ld\n", nst);
  printf("Number of function evaluations = %-6ld\n", nfe);

  printf("Number of linear solver setups = %-6ld\n", nsetups);
  printf("Number of Jacobian evaluations = %-6ld\n", nje);

  printf("Number of nonlinear solver iterations = %-6ld\n", nni);
  printf("Number of convergence failures = %-6ld\n", ncfn);
  printf("Number of error test failures = %-6ld\n", netf);

  return (0);
}